

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevmousemanager.cpp
# Opt level: O0

void __thiscall QEvdevMouseManager::addMouse(QEvdevMouseManager *this,QString *deviceNode)

{
  bool bVar1;
  undefined8 uVar2;
  ContextType *in_RSI;
  Object *in_RDI;
  long in_FS_OFFSET;
  unique_ptr<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_> handler;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff0c;
  QEvdevMouseManager *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  unique_ptr<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_> *handler_00;
  QMessageLogger *in_stack_ffffffffffffff20;
  int *deviceNode_00;
  offset_in_QEvdevMouseManager_to_subr *slot;
  Object *sender;
  char local_98 [24];
  offset_in_QEvdevMouseHandler_to_subr in_stack_ffffffffffffff80;
  QString *in_stack_ffffffffffffff88;
  QString *in_stack_ffffffffffffff90;
  ConnectionType in_stack_ffffffffffffffa0;
  undefined1 local_48 [8];
  unique_ptr<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_> local_40;
  char local_38 [32];
  pointer local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = (pointer)0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  sender = in_RDI;
  QtPrivateLogging::qLcEvdevMouse();
  anon_unknown.dwarf_125644::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffff10,
             (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_125644::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x139cb3);
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               (char *)0x139ccc);
    QtPrivate::asString((QString *)in_RSI);
    uVar2 = QString::utf16();
    QMessageLogger::debug(local_38,"Adding mouse at %ls",uVar2);
    local_10 = 0;
  }
  local_40._M_t.super___uniq_ptr_impl<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_>.
  _M_t.super__Tuple_impl<0UL,_QEvdevMouseHandler_*,_std::default_delete<QEvdevMouseHandler>_>.
  super__Head_base<0UL,_QEvdevMouseHandler_*,_false>._M_head_impl =
       (__uniq_ptr_data<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>,_true,_true>)
       (__uniq_ptr_impl<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_>)
       0xaaaaaaaaaaaaaaaa;
  QEvdevMouseHandler::create(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_> *)
                     0x139d38);
  if (bVar1) {
    handler_00 = &local_40;
    std::unique_ptr<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_>::get
              ((unique_ptr<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_> *)0x139d53)
    ;
    slot = (offset_in_QEvdevMouseManager_to_subr *)0x0;
    in_stack_ffffffffffffff10 = (QEvdevMouseManager *)local_48;
    QObject::
    connect<void(QEvdevMouseHandler::*)(int,int,bool,QFlags<Qt::MouseButton>,Qt::MouseButton,QEvent::Type),void(QEvdevMouseManager::*)(int,int,bool,QFlags<Qt::MouseButton>,Qt::MouseButton,QEvent::Type)>
              (sender,in_stack_ffffffffffffff80,in_RSI,(offset_in_QEvdevMouseManager_to_subr *)0x0,
               in_stack_ffffffffffffffa0);
    QMetaObject::Connection::~Connection((Connection *)in_stack_ffffffffffffff10);
    std::unique_ptr<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_>::get
              ((unique_ptr<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_> *)0x139dcc)
    ;
    uVar3 = 0;
    QObject::connect<void(QEvdevMouseHandler::*)(QPoint),void(QEvdevMouseManager::*)(QPoint)>
              (sender,in_stack_ffffffffffffff80,in_RSI,slot,in_stack_ffffffffffffffa0);
    QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffa0);
    deviceNode_00 = &in_RDI->m_fd;
    std::unique_ptr<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_>::unique_ptr
              ((unique_ptr<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_> *)
               in_stack_ffffffffffffff10,
               (unique_ptr<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_> *)
               CONCAT44(in_stack_ffffffffffffff0c,uVar3));
    QtInputSupport::DeviceHandlerList<QEvdevMouseHandler>::add
              ((DeviceHandlerList<QEvdevMouseHandler> *)in_RSI,(QString *)deviceNode_00,handler_00);
    std::unique_ptr<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_>::~unique_ptr
              ((unique_ptr<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_> *)
               in_stack_ffffffffffffff10);
    updateDeviceCount(in_stack_ffffffffffffff10);
  }
  else {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    QtPrivate::asString((QString *)in_RSI);
    uVar2 = QString::utf16();
    QMessageLogger::warning(local_98,"evdevmouse: Failed to open mouse device %ls",uVar2);
  }
  std::unique_ptr<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_>::~unique_ptr
            ((unique_ptr<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_> *)
             in_stack_ffffffffffffff10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEvdevMouseManager::addMouse(const QString &deviceNode)
{
    qCDebug(qLcEvdevMouse, "Adding mouse at %ls", qUtf16Printable(deviceNode));
    auto handler = QEvdevMouseHandler::create(deviceNode, m_spec);
    if (handler) {
        connect(handler.get(), &QEvdevMouseHandler::handleMouseEvent,
                this, &QEvdevMouseManager::handleMouseEvent);
        connect(handler.get(), &QEvdevMouseHandler::handleWheelEvent,
                this, &QEvdevMouseManager::handleWheelEvent);
        m_mice.add(deviceNode, std::move(handler));
        updateDeviceCount();
    } else {
        qWarning("evdevmouse: Failed to open mouse device %ls", qUtf16Printable(deviceNode));
    }
}